

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::setCurrentPath(QFileSystemEntry *path)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::nativeFilePath((NativePath *)&local_30,path);
  if (local_30.ptr == (char *)0x0) {
    local_30.ptr = &QByteArray::_empty;
  }
  iVar1 = chdir(local_30.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return -1 < iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setCurrentPath(const QFileSystemEntry &path)
{
    int r;
    r = QT_CHDIR(path.nativeFilePath().constData());
    return r >= 0;
}